

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSpecsOf.hpp
# Opt level: O2

GridSpecsBase * __thiscall
sciplot::LineSpecsOf<sciplot::GridSpecsBase>::lineWidth
          (LineSpecsOf<sciplot::GridSpecsBase> *this,int value)

{
  int local_54;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_54 = value;
  internal::str<int>(&local_50,&local_54);
  std::operator+(&local_30,"linewidth ",&local_50);
  std::__cxx11::string::operator=((string *)&this->m_linewidth,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return (GridSpecsBase *)this;
}

Assistant:

auto LineSpecsOf<DerivedSpecs>::lineWidth(int value) -> DerivedSpecs&
{
    m_linewidth = "linewidth " + internal::str(value);
    return static_cast<DerivedSpecs&>(*this);
}